

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memutil.cc
# Opt level: O3

char * absl::strings_internal::memmatch(char *phaystack,size_t haylen,char *pneedle,size_t neelen)

{
  char cVar1;
  size_t __n;
  int iVar2;
  char *__s1;
  
  if (neelen != 0) {
    if (neelen <= haylen) {
      __n = (haylen - neelen) + 1;
      cVar1 = *pneedle;
      for (__s1 = (char *)memchr(phaystack,(int)cVar1,__n); __s1 != (char *)0x0;
          __s1 = (char *)memchr(__s1 + 1,(int)cVar1,(size_t)(phaystack + (__n - (long)(__s1 + 1)))))
      {
        iVar2 = bcmp(__s1,pneedle,neelen);
        if (iVar2 == 0) {
          return __s1;
        }
      }
    }
    phaystack = (char *)0x0;
  }
  return phaystack;
}

Assistant:

const char* memmatch(const char* phaystack, size_t haylen, const char* pneedle,
                     size_t neelen) {
  if (0 == neelen) {
    return phaystack;  // even if haylen is 0
  }
  if (haylen < neelen) return nullptr;

  const char* match;
  const char* hayend = phaystack + haylen - neelen + 1;
  // A static cast is used here to work around the fact that memchr returns
  // a void* on Posix-compliant systems and const void* on Windows.
  while ((match = static_cast<const char*>(
              memchr(phaystack, pneedle[0], hayend - phaystack)))) {
    if (memcmp(match, pneedle, neelen) == 0)
      return match;
    else
      phaystack = match + 1;
  }
  return nullptr;
}